

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O3

Abc_Ntk_t * Abc_NtkDarSeqSweep(Abc_Ntk_t *pNtk,Fra_Ssw_t *pPars)

{
  int iVar1;
  Abc_Ntk_t *pNtk_00;
  Aig_Man_t *pManAig;
  Aig_Man_t *pMan;
  Abc_Ntk_t *pAVar2;
  Vec_Ptr_t *pVVar3;
  long lVar4;
  long lVar5;
  int level;
  timespec ts_1;
  Fraig_Params_t Params;
  timespec local_78;
  Fraig_Params_t local_68;
  
  iVar1 = clock_gettime(3,(timespec *)&local_68);
  if (iVar1 < 0) {
    lVar4 = 1;
  }
  else {
    lVar4 = SUB168(SEXT816(-0x20c49ba5e353f7cf) *
                   SEXT816(CONCAT44(local_68.nSeconds,local_68.nBTLimit)),8);
    lVar4 = ((lVar4 >> 7) - (lVar4 >> 0x3f)) + local_68._0_8_ * -1000000;
  }
  Fraig_ParamsSetDefault(&local_68);
  local_68.nBTLimit = 100000;
  if ((pPars->fFraiging == 0) || (pPars->nPartSize != 0)) {
    pNtk_00 = Abc_NtkDup(pNtk);
  }
  else {
    pAVar2 = pNtk;
    pNtk_00 = Abc_NtkFraig(pNtk,&local_68,0,0);
    if (pPars->fVerbose != 0) {
      Abc_Print((int)pAVar2,"%s =","Initial fraiging time");
      level = 3;
      iVar1 = clock_gettime(3,&local_78);
      if (iVar1 < 0) {
        lVar5 = -1;
      }
      else {
        lVar5 = local_78.tv_nsec / 1000 + local_78.tv_sec * 1000000;
      }
      Abc_Print(level,"%9.2f sec\n",(double)(lVar5 + lVar4) / 1000000.0);
    }
  }
  pAVar2 = (Abc_Ntk_t *)0x0;
  pManAig = Abc_NtkToDar(pNtk_00,0,1);
  Abc_NtkDelete(pNtk_00);
  if (pManAig != (Aig_Man_t *)0x0) {
    pMan = Fra_FraigInduction(pManAig,pPars);
    Aig_ManStop(pManAig);
    if (pMan == (Aig_Man_t *)0x0) {
      pAVar2 = (Abc_Ntk_t *)0x0;
    }
    else {
      if (pMan->nRegs < pNtk->nObjCounts[8]) {
        pAVar2 = Abc_NtkFromDarSeqSweep(pNtk,pMan);
      }
      else {
        pAVar2 = Abc_NtkFromDar(pNtk,pMan);
        pVVar3 = pAVar2->vBoxes;
        if (0 < pVVar3->nSize) {
          lVar4 = 0;
          do {
            if ((*(uint *)((long)pVVar3->pArray[lVar4] + 0x14) & 0xf) == 8) {
              *(undefined8 *)((long)pVVar3->pArray[lVar4] + 0x38) = 1;
              pVVar3 = pAVar2->vBoxes;
            }
            lVar4 = lVar4 + 1;
          } while (lVar4 < pVVar3->nSize);
        }
      }
      Aig_ManStop(pMan);
    }
  }
  return pAVar2;
}

Assistant:

Abc_Ntk_t * Abc_NtkDarSeqSweep( Abc_Ntk_t * pNtk, Fra_Ssw_t * pPars )
{
    Fraig_Params_t Params;
    Abc_Ntk_t * pNtkAig = NULL, * pNtkFraig;
    Aig_Man_t * pMan, * pTemp;
    abctime clk = Abc_Clock();

    // preprocess the miter by fraiging it
    // (note that for each functional class, fraiging leaves one representative;
    // so fraiging does not reduce the number of functions represented by nodes
    Fraig_ParamsSetDefault( &Params );
    Params.nBTLimit = 100000;
    if ( pPars->fFraiging && pPars->nPartSize == 0 )
    {
        pNtkFraig = Abc_NtkFraig( pNtk, &Params, 0, 0 );
if ( pPars->fVerbose ) 
{
ABC_PRT( "Initial fraiging time", Abc_Clock() - clk );
}
    }
    else
        pNtkFraig = Abc_NtkDup( pNtk );

    pMan = Abc_NtkToDar( pNtkFraig, 0, 1 );
    Abc_NtkDelete( pNtkFraig );
    if ( pMan == NULL )
        return NULL;

//    pPars->TimeLimit = 5.0;
    pMan = Fra_FraigInduction( pTemp = pMan, pPars );
    Aig_ManStop( pTemp );
    if ( pMan )
    {
        if ( Aig_ManRegNum(pMan) < Abc_NtkLatchNum(pNtk) )
            pNtkAig = Abc_NtkFromDarSeqSweep( pNtk, pMan );
        else
        {
            Abc_Obj_t * pObj;
            int i;
            pNtkAig = Abc_NtkFromDar( pNtk, pMan );
            Abc_NtkForEachLatch( pNtkAig, pObj, i )
                Abc_LatchSetInit0( pObj );
        }
        Aig_ManStop( pMan );
    }
    return pNtkAig;
}